

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O2

void mat_vec(csc *A,c_float *x,c_float *y,c_int plus_eq)

{
  c_int *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  c_int cVar6;
  
  if (plus_eq == 0) {
    lVar5 = 0;
    lVar3 = A->m;
    if (A->m < 1) {
      lVar3 = lVar5;
    }
    for (; lVar3 != lVar5; lVar5 = lVar5 + 1) {
      y[lVar5] = 0.0;
    }
  }
  lVar3 = A->n;
  pcVar1 = A->p;
  if (pcVar1[lVar3] != 0) {
    lVar5 = 0;
    if (0 < lVar3) {
      lVar5 = lVar3;
    }
    if (plus_eq == -1) {
      lVar3 = 0;
      while (lVar4 = lVar3, lVar4 != lVar5) {
        lVar2 = pcVar1[lVar4 + 1];
        for (cVar6 = pcVar1[lVar4]; lVar3 = lVar4 + 1, cVar6 < lVar2; cVar6 = cVar6 + 1) {
          y[A->i[cVar6]] = y[A->i[cVar6]] - A->x[cVar6] * x[lVar4];
        }
      }
    }
    else {
      lVar3 = 0;
      while (lVar4 = lVar3, lVar4 != lVar5) {
        lVar2 = pcVar1[lVar4 + 1];
        for (cVar6 = pcVar1[lVar4]; lVar3 = lVar4 + 1, cVar6 < lVar2; cVar6 = cVar6 + 1) {
          y[A->i[cVar6]] = A->x[cVar6] * x[lVar4] + y[A->i[cVar6]];
        }
      }
    }
  }
  return;
}

Assistant:

void mat_vec(const csc *A, const c_float *x, c_float *y, c_int plus_eq) {
  c_int i, j;

  if (!plus_eq) {
    // y = 0
    for (i = 0; i < A->m; i++) {
      y[i] = 0;
    }
  }

  // if A is empty
  if (A->p[A->n] == 0) {
    return;
  }

  if (plus_eq == -1) {
    // y -=  A*x
    for (j = 0; j < A->n; j++) {
      for (i = A->p[j]; i < A->p[j + 1]; i++) {
        y[A->i[i]] -= A->x[i] * x[j];
      }
    }
  } else {
    // y +=  A*x
    for (j = 0; j < A->n; j++) {
      for (i = A->p[j]; i < A->p[j + 1]; i++) {
        y[A->i[i]] += A->x[i] * x[j];
      }
    }
  }
}